

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

const_iterator __thiscall
phmap::priv::
base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
::find(base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
       *this,key_type *key)

{
  const_iterator checker_iter;
  const_iterator cVar1;
  const_iterator cVar3;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>
  bVar2;
  
  cVar1 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
          ::find<long>((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                        *)this,key);
  checker_iter = std::
                 _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                 ::find(&(this->checker_)._M_t,key);
  bVar2._12_4_ = 0;
  bVar2.node = (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                *)SUB128(cVar1._0_12_,0);
  bVar2.position = SUB124(cVar1._0_12_,8);
  bVar2 = base_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
          ::
          iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>const,std::pair<long_const,long>const&,std::pair<long_const,long>const*>,std::_Rb_tree_const_iterator<std::pair<long_const,long>>>
                    ((base_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
                      *)this,bVar2,
                     (_Rb_tree_const_iterator<std::pair<const_long,_long>_>)checker_iter._M_node);
  cVar3.node = bVar2.node;
  cVar3.position = bVar2.position;
  cVar3._12_4_ = bVar2._12_4_;
  return cVar3;
}

Assistant:

const_iterator find(const key_type &key) const {
        return iter_check(tree_.find(key), checker_.find(key));
    }